

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

Measurement *
pospopcnt_wrapper<void(*)(unsigned_char_const*,unsigned_long,unsigned_int*),unsigned_char>
          (_func_void_uchar_ptr_unsigned_long_uint_ptr *measured_function,
          _func_void_uchar_ptr_unsigned_long_uint_ptr *reference_function,int iterations,uchar *data
          ,size_t n)

{
  undefined8 uVar1;
  clockdef end;
  int extraout_EAX;
  int iVar2;
  clockdef start;
  int in_ECX;
  undefined4 extraout_EDX;
  code *in_RDX;
  code *in_RSI;
  Measurement *in_RDI;
  undefined8 in_R8;
  size_t in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  clockdef t2;
  clockdef t1;
  int i;
  StatisticsBuilder stats;
  uint32_t cycles_high1;
  uint32_t cycles_low1;
  uint32_t cycles_high;
  uint32_t cycles_low;
  uint32_t flags_truth [8];
  uint32_t counters [8];
  int flags_count;
  size_t in_stack_00002608;
  uchar *in_stack_00002610;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  Measurement *vals;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffef4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  int local_bc;
  StatisticsBuilder *in_stack_ffffffffffffff70;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 local_34;
  size_t local_30;
  undefined8 local_28;
  int local_1c;
  code *local_18;
  code *local_10;
  
  local_34 = 8;
  vals = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(&local_58,0,0x20);
  memset(&local_78,0,0x20);
  StatisticsBuilder::StatisticsBuilder
            ((StatisticsBuilder *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (size_t)vals);
  if (extraout_EAX == 0) {
    cpuid_basic_info(0);
  }
  else if (extraout_EAX == 1) {
    cpuid_Version_info(1);
  }
  else if (extraout_EAX == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (extraout_EAX == 3) {
    cpuid_serial_info(3);
  }
  else if (extraout_EAX == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (extraout_EAX == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (extraout_EAX == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (extraout_EAX == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (extraout_EAX == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (extraout_EAX == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (extraout_EAX == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (extraout_EAX == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (extraout_EAX == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (extraout_EAX == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (extraout_EAX == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (extraout_EAX == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(extraout_EAX);
  }
  uVar1 = rdtsc();
  uVar4 = (undefined4)((ulong)uVar1 >> 0x20);
  iVar5 = (int)uVar1;
  rdtscp();
  if (iVar5 == 0) {
    cpuid_basic_info(0);
  }
  else if (iVar5 == 1) {
    cpuid_Version_info(1);
  }
  else if (iVar5 == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (iVar5 == 3) {
    cpuid_serial_info(3);
  }
  else if (iVar5 == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (iVar5 == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (iVar5 == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (iVar5 == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (iVar5 == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (iVar5 == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (iVar5 == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (iVar5 == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (iVar5 == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (iVar5 == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (iVar5 == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (iVar5 == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(iVar5);
  }
  if (iVar5 == 0) {
    cpuid_basic_info(0);
  }
  else if (iVar5 == 1) {
    cpuid_Version_info(1);
  }
  else if (iVar5 == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (iVar5 == 3) {
    cpuid_serial_info(3);
  }
  else if (iVar5 == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (iVar5 == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (iVar5 == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (iVar5 == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (iVar5 == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (iVar5 == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (iVar5 == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (iVar5 == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (iVar5 == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (iVar5 == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (iVar5 == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (iVar5 == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(iVar5);
  }
  uVar1 = rdtsc();
  uVar8 = (undefined4)((ulong)uVar1 >> 0x20);
  iVar9 = (int)uVar1;
  rdtscp();
  if (iVar9 == 0) {
    cpuid_basic_info(0);
  }
  else if (iVar9 == 1) {
    cpuid_Version_info(1);
  }
  else if (iVar9 == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (iVar9 == 3) {
    cpuid_serial_info(3);
  }
  else if (iVar9 == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (iVar9 == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (iVar9 == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (iVar9 == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (iVar9 == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (iVar9 == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (iVar9 == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (iVar9 == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (iVar9 == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (iVar9 == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (iVar9 == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (iVar9 == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(iVar9);
  }
  uVar6 = uVar4;
  iVar7 = iVar5;
  uVar10 = uVar8;
  iVar11 = iVar9;
  for (local_bc = 0; auVar3 = in_ZMM0._0_16_, local_bc < local_1c; local_bc = local_bc + 1) {
    local_58 = 0;
    uStack_50 = 0;
    uStack_48 = 0;
    uStack_40 = 0;
    local_78 = 0;
    uStack_70 = 0;
    uStack_68 = 0;
    uStack_60 = 0;
    generate_random_data<unsigned_char>(in_stack_00002610,in_stack_00002608);
    (*local_18)(local_28,local_30,&local_78);
    iVar2 = std::chrono::_V2::system_clock::now();
    if (iVar2 == 0) {
      cpuid_basic_info(0);
    }
    else if (iVar2 == 1) {
      cpuid_Version_info(1);
    }
    else if (iVar2 == 2) {
      cpuid_cache_tlb_info(2);
    }
    else if (iVar2 == 3) {
      cpuid_serial_info(3);
    }
    else if (iVar2 == 4) {
      cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (iVar2 == 5) {
      cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (iVar2 == 6) {
      cpuid_Thermal_Power_Management_info(6);
    }
    else if (iVar2 == 7) {
      cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (iVar2 == 9) {
      cpuid_Direct_Cache_Access_info(9);
    }
    else if (iVar2 == 10) {
      cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (iVar2 == 0xb) {
      cpuid_Extended_Topology_info(0xb);
    }
    else if (iVar2 == 0xd) {
      cpuid_Processor_Extended_States_info(0xd);
    }
    else if (iVar2 == 0xf) {
      cpuid_Quality_of_Service_info(0xf);
    }
    else if (iVar2 == -0x7ffffffe) {
      cpuid_brand_part1_info(0x80000002);
    }
    else if (iVar2 == -0x7ffffffd) {
      cpuid_brand_part2_info(0x80000003);
    }
    else if (iVar2 == -0x7ffffffc) {
      cpuid_brand_part3_info(0x80000004);
    }
    else {
      cpuid(iVar2);
    }
    uVar1 = rdtsc();
    iVar2 = (int)uVar1;
    in_stack_fffffffffffffed4 = (*local_10)(local_28,local_30,&local_58);
    rdtscp();
    if (in_stack_fffffffffffffed4 == 0) {
      cpuid_basic_info(0);
    }
    else if (in_stack_fffffffffffffed4 == 1) {
      cpuid_Version_info(1);
    }
    else if (in_stack_fffffffffffffed4 == 2) {
      cpuid_cache_tlb_info(2);
    }
    else if (in_stack_fffffffffffffed4 == 3) {
      cpuid_serial_info(3);
    }
    else if (in_stack_fffffffffffffed4 == 4) {
      cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (in_stack_fffffffffffffed4 == 5) {
      cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (in_stack_fffffffffffffed4 == 6) {
      cpuid_Thermal_Power_Management_info(6);
    }
    else if (in_stack_fffffffffffffed4 == 7) {
      cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (in_stack_fffffffffffffed4 == 9) {
      cpuid_Direct_Cache_Access_info(9);
    }
    else if (in_stack_fffffffffffffed4 == 10) {
      cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (in_stack_fffffffffffffed4 == 0xb) {
      cpuid_Extended_Topology_info(0xb);
    }
    else if (in_stack_fffffffffffffed4 == 0xd) {
      cpuid_Processor_Extended_States_info(0xd);
    }
    else if (in_stack_fffffffffffffed4 == 0xf) {
      cpuid_Quality_of_Service_info(0xf);
    }
    else if (in_stack_fffffffffffffed4 == -0x7ffffffe) {
      cpuid_brand_part1_info(0x80000002);
    }
    else if (in_stack_fffffffffffffed4 == -0x7ffffffd) {
      cpuid_brand_part2_info(0x80000003);
    }
    else if (in_stack_fffffffffffffed4 == -0x7ffffffc) {
      cpuid_brand_part3_info(0x80000004);
    }
    else {
      cpuid(in_stack_fffffffffffffed4);
    }
    in_stack_fffffffffffffed0 = extraout_EDX;
    start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    in_ZMM0._8_56_ = extraout_var;
    in_ZMM0._0_8_ = extraout_XMM0_Qa;
    assert_truth((uint32_t *)vals,(uint32_t *)in_RDI,iVar2);
    end.__d.__r._4_4_ = iVar11;
    end.__d.__r._0_4_ = uVar10;
    StatisticsBuilder::add_record
              ((StatisticsBuilder *)CONCAT44(iVar9,uVar8),start,end,CONCAT44(iVar7,uVar6),
               CONCAT44(iVar5,uVar4));
  }
  StatisticsBuilder::calculate(in_stack_ffffffffffffff70);
  in_RDI->count = local_30;
  in_RDI->size = in_RDI->count;
  auVar3 = vcvtusi2sd_avx512f(auVar3,in_RDI->size);
  in_RDI->throughput = (auVar3._0_8_ / 1048576.0) / ((in_RDI->time).mean / 1000000000.0);
  StatisticsBuilder::~StatisticsBuilder
            ((StatisticsBuilder *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  return vals;
}

Assistant:

Measurement pospopcnt_wrapper(
    pospopcnt_function_type measured_function,
    pospopcnt_function_type reference_function,
    int iterations,
    ItemType* data,
    size_t n)
{
    static_assert(std::is_unsigned<ItemType>::value, "ItemType must be an unsigned type");
    constexpr const int flags_count = pospopcnt_flags_count<ItemType>::value;

    // Set counters to 0.
    uint32_t counters[flags_count] = {0};
    uint32_t flags_truth[flags_count] = {0};

    uint32_t cycles_low = 0, cycles_high = 0;
    uint32_t cycles_low1 = 0, cycles_high1 = 0;
    // Start timer.
    
    StatisticsBuilder stats(iterations);

#ifndef _MSC_VER
// Intel guide:
// @see: https://www.intel.com/content/dam/www/public/us/en/documents/white-papers/ia-32-ia-64-benchmark-code-execution-paper.pdf
asm   volatile ("CPUID\n\t"
                "RDTSC\n\t"
                "mov %%edx, %0\n\t"
                "mov %%eax, %1\n\t": "=r" (cycles_high), "=r" (cycles_low):: "%rax", "%rbx", "%rcx", "%rdx"); 
asm   volatile("RDTSCP\n\t"
               "mov %%edx, %0\n\t"
               "mov %%eax, %1\n\t"
               "CPUID\n\t": "=r" (cycles_high1), "=r" (cycles_low1):: "%rax", "%rbx", "%rcx", "%rdx"); 
asm   volatile ("CPUID\n\t"
                "RDTSC\n\t"
                "mov %%edx, %0\n\t"
                "mov %%eax, %1\n\t": "=r" (cycles_high), "=r" (cycles_low):: "%rax", "%rbx", "%rcx", "%rdx"); 
asm   volatile("RDTSCP\n\t"
               "mov %%edx, %0\n\t"
               "mov %%eax, %1\n\t"
               "CPUID\n\t": "=r" (cycles_high1), "=r" (cycles_low1):: "%rax", "%rbx", "%rcx", "%rdx");
#endif

    for (int i = 0; i < iterations; ++i) {
        memset(counters, 0, sizeof(counters));
        memset(flags_truth, 0, sizeof(flags_truth));
        generate_random_data(data, n);

        reference_function(data, n, flags_truth);

        const clockdef t1 = std::chrono::high_resolution_clock::now();

#ifndef _MSC_VER 
    asm   volatile ("CPUID\n\t"
                    "RDTSC\n\t"
                    "mov %%edx, %0\n\t"
                    "mov %%eax, %1\n\t": "=r" (cycles_high), "=r" (cycles_low):: "%rax", "%rbx", "%rcx", "%rdx");
#endif
    // Call argument subroutine pointer.
    measured_function(data, n, counters);

#ifndef _MSC_VER 
    asm   volatile("RDTSCP\n\t"
                   "mov %%edx, %0\n\t"
                   "mov %%eax, %1\n\t"
                   "CPUID\n\t": "=r" (cycles_high1), "=r" (cycles_low1):: "%rax", "%rbx", "%rcx", "%rdx");
#endif

        const clockdef t2 = std::chrono::high_resolution_clock::now();

        assert_truth(counters, flags_truth, flags_count);

#define RDTSC_u64(high, low) (((uint64_t)(high) << 32)|(low))
        stats.add_record(t1, t2, RDTSC_u64(cycles_high, cycles_low), RDTSC_u64(cycles_high1, cycles_low1));
#undef RDTSC_u64
    }

    auto meas       = stats.calculate();
    meas.count      = n;
    meas.size       = meas.count * sizeof(ItemType);
    meas.throughput = (meas.size / (1024*1024.0)) / (meas.time.mean / 1000000000.0);

    return meas;
}